

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

PhysicalDevice * __thiscall
vkb::PhysicalDeviceSelector::populate_device_details
          (PhysicalDevice *__return_storage_ptr__,PhysicalDeviceSelector *this,
          VkPhysicalDevice vk_phys_device,GenericFeatureChain *src_extended_features_chain)

{
  VkSurfaceKHR pVVar1;
  bool bVar2;
  VulkanFunctions *pVVar3;
  reference __s;
  VkPhysicalDevice_T **ts;
  undefined1 local_1e0 [8];
  VkPhysicalDeviceFeatures2 local_features;
  undefined1 local_e8 [7];
  bool instance_is_1_1;
  GenericFeatureChain fill_chain;
  value_type local_c8;
  reference local_a8;
  VkExtensionProperties *ext;
  iterator __end1;
  iterator __begin1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range1;
  void *local_80;
  VkResult local_74;
  undefined1 local_70 [4];
  VkResult available_extensions_ret;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> available_extensions;
  undefined1 local_48 [8];
  vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> queue_families;
  GenericFeatureChain *src_extended_features_chain_local;
  VkPhysicalDevice vk_phys_device_local;
  PhysicalDeviceSelector *this_local;
  PhysicalDevice *physical_device;
  
  queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  src_extended_features_chain_local = (GenericFeatureChain *)vk_phys_device;
  vk_phys_device_local = (VkPhysicalDevice)this;
  this_local = (PhysicalDeviceSelector *)__return_storage_ptr__;
  memset(__return_storage_ptr__,0,0x6c0);
  PhysicalDevice::PhysicalDevice(__return_storage_ptr__);
  __return_storage_ptr__->physical_device = (VkPhysicalDevice)src_extended_features_chain_local;
  pVVar1 = (this->instance_info).surface;
  __return_storage_ptr__->surface = pVVar1;
  ts = (VkPhysicalDevice_T **)
       (CONCAT71((int7)((ulong)pVVar1 >> 8),(this->criteria).defer_surface_initialization) &
       0xffffffffffffff01);
  __return_storage_ptr__->defer_surface_initialization = SUB81(ts,0);
  __return_storage_ptr__->instance_version = (this->instance_info).version;
  pVVar3 = detail::vulkan_functions();
  detail::
  get_vector_noerror<VkQueueFamilyProperties,void(*&)(VkPhysicalDevice_T*,unsigned_int*,VkQueueFamilyProperties*),VkPhysicalDevice_T*&>
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)local_48,
             (detail *)&pVVar3->fp_vkGetPhysicalDeviceQueueFamilyProperties,
             (_func_void_VkPhysicalDevice_T_ptr_uint_ptr_VkQueueFamilyProperties_ptr **)
             &src_extended_features_chain_local,ts);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::operator=
            (&__return_storage_ptr__->queue_families,
             (vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)local_48);
  pVVar3 = detail::vulkan_functions();
  (*pVVar3->fp_vkGetPhysicalDeviceProperties)
            ((VkPhysicalDevice)src_extended_features_chain_local,&__return_storage_ptr__->properties
            );
  pVVar3 = detail::vulkan_functions();
  (*pVVar3->fp_vkGetPhysicalDeviceFeatures)
            ((VkPhysicalDevice)src_extended_features_chain_local,&__return_storage_ptr__->features);
  pVVar3 = detail::vulkan_functions();
  (*pVVar3->fp_vkGetPhysicalDeviceMemoryProperties)
            ((VkPhysicalDevice)src_extended_features_chain_local,
             &__return_storage_ptr__->memory_properties);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(__return_storage_ptr__->properties).deviceName);
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_70);
  pVVar3 = detail::vulkan_functions();
  local_80 = (void *)0x0;
  local_74 = detail::
             get_vector<VkExtensionProperties,VkResult(*&)(VkPhysicalDevice_T*,char_const*,unsigned_int*,VkExtensionProperties*),VkPhysicalDevice_T*&,decltype(nullptr)>
                       ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                        local_70,(_func_VkResult_VkPhysicalDevice_T_ptr_char_ptr_uint_ptr_VkExtensionProperties_ptr
                                  **)&pVVar3->fp_vkEnumerateDeviceExtensionProperties,
                        (VkPhysicalDevice_T **)&src_extended_features_chain_local,&local_80);
  if (local_74 == VK_SUCCESS) {
    __end1 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                       ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                        local_70);
    ext = (VkExtensionProperties *)
          std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                     local_70);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                  *)&ext);
      if (!bVar2) break;
      __s = __gnu_cxx::
            __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
            ::operator*(&__end1);
      local_a8 = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,__s->extensionName,
                 (allocator<char> *)
                 ((long)&fill_chain.nodes.
                         super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&__return_storage_ptr__->available_extensions,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&fill_chain.nodes.
                         super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      __gnu_cxx::
      __normal_iterator<VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
      ::operator++(&__end1);
    }
    __return_storage_ptr__->properties2_ext_enabled =
         (bool)((this->instance_info).properties2_ext_enabled & 1);
    detail::GenericFeatureChain::GenericFeatureChain
              ((GenericFeatureChain *)local_e8,src_extended_features_chain);
    local_features._239_1_ = 0x400fff < (this->instance_info).version;
    bVar2 = std::
            vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
            ::empty((vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
                     *)local_e8);
    if ((!bVar2) &&
       (((local_features._239_1_ & 1) != 0 ||
        (((this->instance_info).properties2_ext_enabled & 1U) != 0)))) {
      memset(local_1e0,0,0xf0);
      detail::GenericFeatureChain::chain_up
                ((GenericFeatureChain *)local_e8,(VkPhysicalDeviceFeatures2 *)local_1e0);
      if ((local_features._239_1_ & 1) == 0) {
        pVVar3 = detail::vulkan_functions();
        (*pVVar3->fp_vkGetPhysicalDeviceFeatures2KHR)
                  ((VkPhysicalDevice)src_extended_features_chain_local,
                   (VkPhysicalDeviceFeatures2 *)local_1e0);
      }
      else {
        pVVar3 = detail::vulkan_functions();
        (*pVVar3->fp_vkGetPhysicalDeviceFeatures2)
                  ((VkPhysicalDevice)src_extended_features_chain_local,
                   (VkPhysicalDeviceFeatures2 *)local_1e0);
      }
      detail::GenericFeatureChain::operator=
                (&__return_storage_ptr__->extended_features_chain,(GenericFeatureChain *)local_e8);
    }
    queue_families.
    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
    detail::GenericFeatureChain::~GenericFeatureChain((GenericFeatureChain *)local_e8);
  }
  else {
    queue_families.
    super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  }
  std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::~vector
            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)local_70);
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::~vector
            ((vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_> *)local_48);
  if ((queue_families.
       super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    PhysicalDevice::~PhysicalDevice(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

PhysicalDevice PhysicalDeviceSelector::populate_device_details(
    VkPhysicalDevice vk_phys_device, detail::GenericFeatureChain const& src_extended_features_chain) const {
    PhysicalDevice physical_device{};
    physical_device.physical_device = vk_phys_device;
    physical_device.surface = instance_info.surface;
    physical_device.defer_surface_initialization = criteria.defer_surface_initialization;
    physical_device.instance_version = instance_info.version;
    auto queue_families = detail::get_vector_noerror<VkQueueFamilyProperties>(
        detail::vulkan_functions().fp_vkGetPhysicalDeviceQueueFamilyProperties, vk_phys_device);
    physical_device.queue_families = queue_families;

    detail::vulkan_functions().fp_vkGetPhysicalDeviceProperties(vk_phys_device, &physical_device.properties);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures(vk_phys_device, &physical_device.features);
    detail::vulkan_functions().fp_vkGetPhysicalDeviceMemoryProperties(vk_phys_device, &physical_device.memory_properties);

    physical_device.name = physical_device.properties.deviceName;

    std::vector<VkExtensionProperties> available_extensions;
    auto available_extensions_ret = detail::get_vector<VkExtensionProperties>(
        available_extensions, detail::vulkan_functions().fp_vkEnumerateDeviceExtensionProperties, vk_phys_device, nullptr);
    if (available_extensions_ret != VK_SUCCESS) return physical_device;
    for (const auto& ext : available_extensions) {
        physical_device.available_extensions.push_back(&ext.extensionName[0]);
    }

    physical_device.properties2_ext_enabled = instance_info.properties2_ext_enabled;

    auto fill_chain = src_extended_features_chain;

    bool instance_is_1_1 = instance_info.version >= VKB_VK_API_VERSION_1_1;
    if (!fill_chain.nodes.empty() && (instance_is_1_1 || instance_info.properties2_ext_enabled)) {
        VkPhysicalDeviceFeatures2 local_features{};
        fill_chain.chain_up(local_features);
        // Use KHR function if not able to use the core function
        if (instance_is_1_1) {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2(vk_phys_device, &local_features);
        } else {
            detail::vulkan_functions().fp_vkGetPhysicalDeviceFeatures2KHR(vk_phys_device, &local_features);
        }
        physical_device.extended_features_chain = fill_chain;
    }

    return physical_device;
}